

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

void EccPoint_mult(uECC_word_t *result,uECC_word_t *point,uECC_word_t *scalar,uECC_word_t *initial_Z
                  ,bitcount_t num_bits,uECC_Curve curve)

{
  uECC_word_t *Y2;
  byte num_words;
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  uECC_word_t *X2;
  long lVar4;
  uECC_word_t *X1;
  uECC_word_t *Y1;
  bool bVar5;
  uECC_word_t Rx [2] [4];
  uECC_word_t Ry [2] [4];
  uECC_word_t product [8];
  uECC_word_t z [4];
  uECC_word_t local_118 [4];
  uECC_word_t local_f8 [4];
  uECC_word_t local_d8 [4];
  uECC_word_t local_b8 [4];
  uECC_word_t local_98 [8];
  uECC_word_t local_58 [5];
  
  num_words = curve->num_words;
  lVar4 = (long)(char)num_words;
  if (0 < lVar4) {
    memcpy(local_f8,point,lVar4 * 8);
  }
  if ('\0' < (char)num_words) {
    memcpy(local_b8,point + lVar4,lVar4 * 8);
  }
  if (initial_Z == (uECC_word_t *)0x0) {
    if ('\0' < (char)num_words) {
      memset(local_98,0,lVar4 * 8);
    }
    local_98[0] = 1;
  }
  else {
    if ((char)num_words < '\x01') goto LAB_001060bd;
    memcpy(local_98,initial_Z,lVar4 * 8);
  }
  if ('\0' < (char)num_words) {
    memmove(local_118,local_f8,lVar4 * 8);
    memmove(local_d8,local_b8,lVar4 * 8);
  }
LAB_001060bd:
  apply_z(local_f8,local_b8,local_98,curve);
  (*curve->double_jacobian)(local_f8,local_b8,local_98,curve);
  apply_z(local_118,local_d8,local_98,curve);
  if (0 < (short)(num_bits - 2U)) {
    uVar2 = (uint)(ushort)(num_bits - 2U);
    do {
      bVar5 = (scalar[uVar2 >> 6] & 1L << ((byte)uVar2 & 0x3f)) == 0;
      uVar3 = (ulong)!bVar5;
      uVar1 = (ulong)bVar5;
      XYcZ_addC(local_118 + uVar3 * 4,local_d8 + uVar3 * 4,local_118 + uVar1 * 4,
                local_d8 + uVar1 * 4,curve);
      XYcZ_add(local_118 + uVar1 * 4,local_d8 + uVar1 * 4,local_118 + uVar3 * 4,local_d8 + uVar3 * 4
               ,curve);
      bVar5 = 1 < (int)uVar2;
      uVar2 = uVar2 - 1;
    } while (bVar5);
  }
  uVar2 = (uint)*scalar & 1;
  uVar3 = (ulong)(uVar2 << 5);
  X1 = (uECC_word_t *)((long)local_118 + uVar3);
  Y1 = (uECC_word_t *)((long)local_d8 + uVar3);
  uVar3 = (ulong)((uVar2 ^ 1) << 5);
  X2 = (uECC_word_t *)((long)local_118 + uVar3);
  Y2 = (uECC_word_t *)((long)local_d8 + uVar3);
  XYcZ_addC(X1,Y1,X2,Y2,curve);
  uECC_vli_modSub(local_58,local_f8,local_118,curve->p,num_words);
  uECC_vli_mult(local_98,local_58,Y1,curve->num_words);
  (*curve->mmod_fast)(local_58,local_98);
  uECC_vli_mult(local_98,local_58,point,curve->num_words);
  (*curve->mmod_fast)(local_58,local_98);
  uECC_vli_modInv(local_58,local_58,curve->p,num_words);
  uECC_vli_mult(local_98,local_58,point + lVar4,curve->num_words);
  (*curve->mmod_fast)(local_58,local_98);
  uECC_vli_mult(local_98,local_58,X1,curve->num_words);
  (*curve->mmod_fast)(local_58,local_98);
  XYcZ_add(X2,Y2,X1,Y1,curve);
  apply_z(local_118,local_d8,local_58,curve);
  if ('\0' < (char)num_words) {
    memcpy(result,local_118,lVar4 * 8);
    memcpy(result + lVar4,local_d8,(ulong)num_words << 3);
  }
  return;
}

Assistant:

static void EccPoint_mult(uECC_word_t * result,
                          const uECC_word_t * point,
                          const uECC_word_t * scalar,
                          const uECC_word_t * initial_Z,
                          bitcount_t num_bits,
                          uECC_Curve curve) {
    /* R0 and R1 */
    uECC_word_t Rx[2][uECC_MAX_WORDS];
    uECC_word_t Ry[2][uECC_MAX_WORDS];
    uECC_word_t z[uECC_MAX_WORDS];
    bitcount_t i;
    uECC_word_t nb;
    wordcount_t num_words = curve->num_words;

    uECC_vli_set(Rx[1], point, num_words);
    uECC_vli_set(Ry[1], point + num_words, num_words);

    XYcZ_initial_double(Rx[1], Ry[1], Rx[0], Ry[0], initial_Z, curve);

    for (i = num_bits - 2; i > 0; --i) {
        nb = !uECC_vli_testBit(scalar, i);
        XYcZ_addC(Rx[1 - nb], Ry[1 - nb], Rx[nb], Ry[nb], curve);
        XYcZ_add(Rx[nb], Ry[nb], Rx[1 - nb], Ry[1 - nb], curve);
    }

    nb = !uECC_vli_testBit(scalar, 0);
    XYcZ_addC(Rx[1 - nb], Ry[1 - nb], Rx[nb], Ry[nb], curve);

    /* Find final 1/Z value. */
    uECC_vli_modSub(z, Rx[1], Rx[0], curve->p, num_words); /* X1 - X0 */
    uECC_vli_modMult_fast(z, z, Ry[1 - nb], curve);               /* Yb * (X1 - X0) */
    uECC_vli_modMult_fast(z, z, point, curve);                    /* xP * Yb * (X1 - X0) */
    uECC_vli_modInv(z, z, curve->p, num_words);            /* 1 / (xP * Yb * (X1 - X0)) */
    /* yP / (xP * Yb * (X1 - X0)) */
    uECC_vli_modMult_fast(z, z, point + num_words, curve);
    uECC_vli_modMult_fast(z, z, Rx[1 - nb], curve); /* Xb * yP / (xP * Yb * (X1 - X0)) */
    /* End 1/Z calculation */

    XYcZ_add(Rx[nb], Ry[nb], Rx[1 - nb], Ry[1 - nb], curve);
    apply_z(Rx[0], Ry[0], z, curve);

    uECC_vli_set(result, Rx[0], num_words);
    uECC_vli_set(result + num_words, Ry[0], num_words);
}